

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateLeaveBlock(jx9_gen_state *pGen,GenBlock **ppBlock)

{
  GenBlock *pBlock;
  sxi32 extraout_EAX;
  
  pBlock = pGen->pCurrent;
  if (pBlock != (GenBlock *)0x0) {
    pGen->pCurrent = pBlock->pParent;
    GenStateFreeBlock(pBlock);
    return extraout_EAX;
  }
  return (sxi32)pGen;
}

Assistant:

static sxi32 GenStateLeaveBlock(jx9_gen_state *pGen, GenBlock **ppBlock)
{
	GenBlock *pBlock = pGen->pCurrent;
	if( pBlock == 0 ){
		/* No more block to pop */
		return SXERR_EMPTY;
	}
	/* Point to the upper block */
	pGen->pCurrent = pBlock->pParent;
	if( ppBlock ){
		/* Write a pointer to the popped block */
		*ppBlock = pBlock;
	}else{
		/* Safely release the block */
		GenStateFreeBlock(&(*pBlock));	
	}
	return SXRET_OK;
}